

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_vote.cxx
# Opt level: O0

bool __thiscall nuraft::raft_server::check_cond_for_zp_election(raft_server *this)

{
  element_type *peVar1;
  uint64_t uVar2;
  long in_RDI;
  timer_helper *unaff_retaddr;
  ptr<raft_params> params;
  context *in_stack_ffffffffffffffd8;
  bool local_1;
  
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x26074f);
  nuraft::context::get_params(in_stack_ffffffffffffffd8);
  peVar1 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x260766);
  if (((((byte)peVar1[0x48] & 1) != 0) && (*(int *)(in_RDI + 0x40) == 1)) &&
     (*(int *)(in_RDI + 0x3c) == 0)) {
    uVar2 = timer_helper::get_ms(unaff_retaddr);
    peVar1 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2607a1);
    if ((ulong)((long)*(int *)(peVar1 + 8) * 0x14) < uVar2) {
      local_1 = true;
      goto LAB_002607ec;
    }
  }
  local_1 = false;
LAB_002607ec:
  std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x2607f6);
  return local_1;
}

Assistant:

bool raft_server::check_cond_for_zp_election() {
    ptr<raft_params> params = ctx_->get_params();
    if ( params->allow_temporary_zero_priority_leader_ &&
         target_priority_ == 1 &&
         my_priority_ == 0 &&
         priority_change_timer_.get_ms() >
            (uint64_t)params->heart_beat_interval_ * 20 ) {
        return true;
    }
    return false;
}